

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O3

void __thiscall Raytracer::Image::Save(Image *this,string *name)

{
  ostream *poVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ofstream file;
  char local_231;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((string *)&local_230);
  std::ofstream::open((string *)&local_230,(_Ios_Openmode)name);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"P6\n",3);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&local_230,this->width);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->height);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n255\n",5);
  iVar3 = this->height;
  if (0 < iVar3) {
    uVar2 = (ulong)(uint)this->width;
    lVar5 = 0;
    do {
      if (0 < (int)uVar2) {
        lVar6 = 0;
        lVar4 = 0;
        do {
          local_231 = (char)(int)*(float *)((long)&this->datas[lVar5]->r + lVar6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,&local_231,1);
          local_231 = (char)(int)*(float *)((long)&this->datas[lVar5]->g + lVar6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,&local_231,1);
          local_231 = (char)(int)*(float *)((long)&this->datas[lVar5]->b + lVar6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,&local_231,1);
          lVar4 = lVar4 + 1;
          uVar2 = (ulong)this->width;
          lVar6 = lVar6 + 0xc;
        } while (lVar4 < (long)uVar2);
        iVar3 = this->height;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar3);
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void Raytracer::Image::Save(std::string name) {
    std::ofstream file;
    file.open(name, std::ofstream::out | std::ofstream::binary);
    file << "P6\n" << width << " " << height << "\n255\n";
    for(int y = 0;y<height;y++){
        for(int x = 0;x<width;x++){
              file << (char)datas[y][x].r;
              file << (char)datas[y][x].g;
              file << (char)datas[y][x].b;

        }
    }
    file.close();
}